

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::form::iterator::iterator(iterator *this,iterator *other)

{
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::deque
            ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)this,
             (deque<unsigned_int,_std::allocator<unsigned_int>_> *)other);
  this->current_ = other->current_;
  this->offset_ = other->offset_;
  booster::copy_ptr<cppcms::form::iterator::_data>::copy_ptr(&this->d,&other->d);
  return;
}

Assistant:

form::iterator::iterator(form::iterator const &other) : 
	return_positions_(other.return_positions_),
	current_(other.current_),
	offset_(other.offset_),
	d(other.d)
{
}